

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

smf_track_t * smf_track_new(void)

{
  smf_track_t *psVar1;
  GPtrArray *pGVar2;
  int *piVar3;
  char *pcVar4;
  
  psVar1 = (smf_track_t *)malloc(0x40);
  if (psVar1 == (smf_track_t *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    psVar1 = (smf_track_t *)0x0;
    g_log("libsmf",8,"Cannot allocate smf_track_t structure: %s",pcVar4);
  }
  else {
    psVar1->has_unterminated_sysex = 0;
    psVar1->next_event_offset = 0;
    psVar1->next_event_number = 0;
    psVar1->time_of_next_event = 0;
    psVar1->events_array = (GPtrArray *)0x0;
    psVar1->user_pointer = (void *)0x0;
    psVar1->file_buffer = (void *)0x0;
    psVar1->file_buffer_length = 0;
    psVar1->last_status = 0;
    psVar1->smf = (smf_t *)0x0;
    psVar1->track_number = 0;
    psVar1->number_of_events = 0;
    psVar1->next_event_number = -1;
    pGVar2 = (GPtrArray *)g_ptr_array_new();
    psVar1->events_array = pGVar2;
    if (pGVar2 == (GPtrArray *)0x0) {
      __assert_fail("track->events_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x75,"smf_track_t *smf_track_new(void)");
    }
  }
  return psVar1;
}

Assistant:

smf_track_t *
smf_track_new(void)
{
	smf_track_t *track = malloc(sizeof(smf_track_t));
	if (track == NULL) {
		g_critical("Cannot allocate smf_track_t structure: %s", strerror(errno));
		return (NULL);
	}

	memset(track, 0, sizeof(smf_track_t));
	track->next_event_number = -1;

	track->events_array = g_ptr_array_new();
	assert(track->events_array);

	return (track);
}